

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O3

void __thiscall
dap::BasicTypeInfo<dap::MemoryEvent>::copyConstruct
          (BasicTypeInfo<dap::MemoryEvent> *this,void *dst,void *src)

{
  *(undefined8 *)dst = *src;
  *(long *)((long)dst + 8) = (long)dst + 0x18;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)dst + 8),*(long *)((long)src + 8),
             *(long *)((long)src + 0x10) + *(long *)((long)src + 8));
  *(undefined8 *)((long)dst + 0x28) = *(undefined8 *)((long)src + 0x28);
  return;
}

Assistant:

inline void copyConstruct(void* dst, const void* src) const override {
    new (dst) T(*reinterpret_cast<const T*>(src));
  }